

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-send-recv.c
# Opt level: O2

void listen_cb(uv_stream_t *handle,int status)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  if ((echo_ctx *)handle == &ctx2) {
    if (status == 0) {
      iVar1 = uv_accept((uv_stream_t *)&ctx2,(uv_stream_t *)&ctx2.channel);
      if (iVar1 == 0) {
        send_recv_start();
        return;
      }
      pcVar3 = "r == 0";
      uVar2 = 0x16e;
    }
    else {
      pcVar3 = "status == 0";
      uVar2 = 0x16b;
    }
  }
  else {
    pcVar3 = "handle == (uv_stream_t*)&ctx2.listen";
    uVar2 = 0x16a;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc-send-recv.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void listen_cb(uv_stream_t* handle, int status) {
  int r;
  ASSERT(handle == (uv_stream_t*)&ctx2.listen);
  ASSERT(status == 0);

  r = uv_accept((uv_stream_t*)&ctx2.listen, (uv_stream_t*)&ctx2.channel);
  ASSERT(r == 0);

  send_recv_start();
}